

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void boost::filesystem::path::m_path_iterator_increment(iterator *it)

{
  size_type sVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  size_type sVar5;
  ulong uVar6;
  value_type *pvVar7;
  path *p;
  bool local_62;
  byte local_61;
  string_type local_40;
  long local_20;
  size_type end_pos;
  iterator *piStack_10;
  bool was_net;
  iterator *it_local;
  
  uVar6 = it->m_pos;
  piStack_10 = it;
  uVar3 = std::__cxx11::string::size();
  if (uVar3 <= uVar6) {
    __assert_fail("(it.m_pos < it.m_path_ptr->m_pathname.size())&&(\"path::basic_iterator increment past end()\")"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/path.cpp"
                  ,0x2f8,
                  "static void boost::filesystem::path::m_path_iterator_increment(path::iterator &)"
                 );
  }
  lVar4 = std::__cxx11::string::size();
  piStack_10->m_pos = lVar4 + piStack_10->m_pos;
  sVar1 = piStack_10->m_pos;
  sVar5 = std::__cxx11::string::size();
  if (sVar1 == sVar5) {
    clear(&piStack_10->m_element);
    return;
  }
  uVar6 = std::__cxx11::string::size();
  local_61 = 0;
  if (2 < uVar6) {
    pvVar7 = (value_type *)std::__cxx11::string::operator[]((ulong)piStack_10);
    bVar2 = anon_unknown.dwarf_f716::is_separator(*pvVar7);
    local_61 = 0;
    if (bVar2) {
      pvVar7 = (value_type *)std::__cxx11::string::operator[]((ulong)piStack_10);
      bVar2 = anon_unknown.dwarf_f716::is_separator(*pvVar7);
      local_61 = 0;
      if (bVar2) {
        pvVar7 = (value_type *)std::__cxx11::string::operator[]((ulong)piStack_10);
        bVar2 = anon_unknown.dwarf_f716::is_separator(*pvVar7);
        local_61 = bVar2 ^ 0xff;
      }
    }
  }
  end_pos._7_1_ = local_61 & 1;
  pvVar7 = (value_type *)std::__cxx11::string::operator[]((ulong)piStack_10->m_path_ptr);
  bVar2 = anon_unknown.dwarf_f716::is_separator(*pvVar7);
  if (bVar2) {
    if ((end_pos._7_1_ & 1) != 0) {
      std::__cxx11::string::operator=((string *)piStack_10,'/');
      return;
    }
    while( true ) {
      sVar1 = piStack_10->m_pos;
      sVar5 = std::__cxx11::string::size();
      local_62 = false;
      if (sVar1 != sVar5) {
        pvVar7 = (value_type *)std::__cxx11::string::operator[]((ulong)piStack_10->m_path_ptr);
        local_62 = anon_unknown.dwarf_f716::is_separator(*pvVar7);
      }
      if (local_62 == false) break;
      piStack_10->m_pos = piStack_10->m_pos + 1;
    }
    sVar1 = piStack_10->m_pos;
    sVar5 = std::__cxx11::string::size();
    if ((sVar1 == sVar5) &&
       (bVar2 = anon_unknown.dwarf_f716::is_root_separator
                          (&piStack_10->m_path_ptr->m_pathname,piStack_10->m_pos - 1), !bVar2)) {
      piStack_10->m_pos = piStack_10->m_pos - 1;
      p = detail::dot_path();
      operator=(&piStack_10->m_element,p);
      return;
    }
  }
  local_20 = std::__cxx11::string::find_first_of((char *)piStack_10->m_path_ptr,0x120c02);
  if (local_20 == -1) {
    local_20 = std::__cxx11::string::size();
  }
  std::__cxx11::string::substr((ulong)&local_40,(ulong)piStack_10->m_path_ptr);
  operator=(&piStack_10->m_element,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void path::m_path_iterator_increment(path::iterator & it)
  {
    BOOST_ASSERT_MSG(it.m_pos < it.m_path_ptr->m_pathname.size(),
      "path::basic_iterator increment past end()");

    // increment to position past current element; if current element is implicit dot,
    // this will cause it.m_pos to represent the end iterator
    it.m_pos += it.m_element.m_pathname.size();

    // if the end is reached, we are done
    if (it.m_pos == it.m_path_ptr->m_pathname.size())
    {
      it.m_element.clear();  // aids debugging, may release unneeded memory
      return;
    }

    // both POSIX and Windows treat paths that begin with exactly two separators specially
    bool was_net(it.m_element.m_pathname.size() > 2
      && is_separator(it.m_element.m_pathname[0])
      && is_separator(it.m_element.m_pathname[1])
      && !is_separator(it.m_element.m_pathname[2]));

    // process separator (Windows drive spec is only case not a separator)
    if (is_separator(it.m_path_ptr->m_pathname[it.m_pos]))
    {
      // detect root directory
      if (was_net
#       ifdef BOOST_WINDOWS_API
        // case "c:/"
        || it.m_element.m_pathname[it.m_element.m_pathname.size()-1] == colon
#       endif
         )
      {
        it.m_element.m_pathname = separator;  // generic format; see docs
        return;
      }

      // skip separators until it.m_pos points to the start of the next element
      while (it.m_pos != it.m_path_ptr->m_pathname.size()
        && is_separator(it.m_path_ptr->m_pathname[it.m_pos]))
        { ++it.m_pos; }

      // detect trailing separator, and treat it as ".", per POSIX spec
      if (it.m_pos == it.m_path_ptr->m_pathname.size()
        && !is_root_separator(it.m_path_ptr->m_pathname, it.m_pos-1)) 
      {
        --it.m_pos;
        it.m_element = detail::dot_path();
        return;
      }
    }

    // get m_element
    size_type end_pos(it.m_path_ptr->m_pathname.find_first_of(separators, it.m_pos));
    if (end_pos == string_type::npos)
      end_pos = it.m_path_ptr->m_pathname.size();
    it.m_element = it.m_path_ptr->m_pathname.substr(it.m_pos, end_pos - it.m_pos);
  }